

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<VmModule::LoadStoreInfo,_32U>::grow
          (SmallArray<VmModule::LoadStoreInfo,_32U> *this,uint newSize)

{
  uint count;
  LoadStoreInfo *pLVar1;
  uint uVar2;
  LoadStoreInfo *pLVar3;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  uint i;
  ulong uVar8;
  byte bVar9;
  
  bVar9 = 0;
  uVar2 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar2) {
    count = uVar2;
  }
  if (this->allocator == (Allocator *)0x0) {
    pLVar1 = (LoadStoreInfo *)(*(code *)NULLC::alloc)(count * 0x58 | 4);
    if (count != 0) {
      pLVar3 = pLVar1;
      do {
        *(undefined8 *)((long)&pLVar3->storeInst + 4) = 0;
        *(undefined8 *)((long)&pLVar3->copyInst + 4) = 0;
        pLVar3->loadInst = (VmInstruction *)0x0;
        pLVar3->storeInst = (VmInstruction *)0x0;
        pLVar3->loadAddress = (VmConstant *)0x0;
        pLVar3->loadPointer = (VmValue *)0x0;
        pLVar3->noLoadOrNoContainerAlias = false;
        pLVar3->noStoreOrNoContainerAlias = false;
        pLVar3->loadOffset = (VmConstant *)0x0;
        pLVar3->storeAddress = (VmConstant *)0x0;
        pLVar3->storePointer = (VmValue *)0x0;
        pLVar3->storeOffset = (VmConstant *)0x0;
        pLVar3 = pLVar3 + 1;
      } while (pLVar3 != pLVar1 + (int)count);
    }
  }
  else {
    pLVar1 = Allocator::construct<VmModule::LoadStoreInfo>(this->allocator,count);
  }
  lVar5 = 0;
  uVar8 = 0;
  while( true ) {
    pLVar3 = this->data;
    if (this->count <= uVar8) break;
    puVar6 = (undefined1 *)((long)&pLVar3->loadInst + lVar5);
    puVar7 = (undefined1 *)((long)&pLVar1->loadInst + lVar5);
    for (lVar4 = 0x52; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    }
    uVar8 = uVar8 + 1;
    lVar5 = lVar5 + 0x58;
  }
  if (pLVar3 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pLVar3 != (LoadStoreInfo *)0x0) {
        (*(code *)NULLC::dealloc)(pLVar3);
      }
    }
    else if (pLVar3 != (LoadStoreInfo *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pLVar1;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}